

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationElementIterator::previous(CollationElementIterator *this,UErrorCode *status)

{
  char cVar1;
  short sVar2;
  uint32_t uVar3;
  int iVar4;
  UBool UVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  UVector32 *pUVar9;
  int64_t iVar10;
  uint uVar11;
  UErrorCode *pUVar12;
  uint uVar13;
  
  if (U_ZERO_ERROR < *status) {
    return -1;
  }
  cVar1 = this->dir_;
  pUVar12 = status;
  if (cVar1 < '\0') {
    uVar3 = this->otherHalf_;
    if (uVar3 != 0) {
      this->otherHalf_ = 0;
      return uVar3;
    }
  }
  else {
    if (cVar1 != '\x01') {
      if (cVar1 != '\0') {
        *status = U_INVALID_STATE_ERROR;
        return -1;
      }
      sVar2 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        uVar13 = (this->string_).fUnion.fFields.fLength;
      }
      else {
        uVar13 = (int)sVar2 >> 5;
      }
      pUVar12 = (UErrorCode *)(ulong)uVar13;
      (*(this->iter_->super_UObject)._vptr_UObject[4])();
    }
    this->dir_ = -1;
  }
  if (this->offsets_ == (UVector32 *)0x0) {
    pUVar9 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)pUVar12);
    if (pUVar9 == (UVector32 *)0x0) {
      pUVar9 = (UVector32 *)0x0;
    }
    else {
      UVector32::UVector32(pUVar9,status);
    }
    this->offsets_ = pUVar9;
    if (pUVar9 == (UVector32 *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return -1;
    }
  }
  iVar6 = 0;
  if ((this->iter_->ceBuffer).length == 0) {
    iVar6 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
  }
  iVar10 = CollationIterator::previousCE(this->iter_,this->offsets_,status);
  if (iVar10 != 0x101000100) {
    uVar7 = (uint)((ulong)iVar10 >> 0x20);
    uVar13 = (uint)((ulong)iVar10 >> 8);
    uVar11 = uVar13 & 0xff | (uint)((ulong)iVar10 >> 0x10) & 0xff00 | uVar7 & 0xffff0000;
    uVar13 = (uint)iVar10 & 0x3f | uVar13 & 0xff00 | uVar7 << 0x10;
    if (uVar13 != 0) {
      pUVar9 = this->offsets_;
      if (pUVar9->count == 0) {
        iVar8 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
        iVar4 = pUVar9->count;
        if (((-2 < iVar4) && (iVar4 < pUVar9->capacity)) ||
           (UVar5 = UVector32::expandCapacity(pUVar9,iVar4 + 1,status), UVar5 != '\0')) {
          pUVar9->elements[pUVar9->count] = iVar8;
          pUVar9->count = pUVar9->count + 1;
        }
        pUVar9 = this->offsets_;
        iVar4 = pUVar9->count;
        if (((-2 < iVar4) && (iVar4 < pUVar9->capacity)) ||
           (UVar5 = UVector32::expandCapacity(pUVar9,iVar4 + 1,status), UVar5 != '\0')) {
          pUVar9->elements[pUVar9->count] = iVar6;
          pUVar9->count = pUVar9->count + 1;
        }
      }
      this->otherHalf_ = uVar11;
      return uVar13 | 0xc0;
    }
    return uVar11;
  }
  return -1;
}

Assistant:

int32_t CollationElementIterator::previous(UErrorCode& status)
{
    if (U_FAILURE(status)) { return NULLORDER; }
    if (dir_ < 0) {
        // Continue backwards iteration. Test this first.
        if (otherHalf_ != 0) {
            uint32_t oh = otherHalf_;
            otherHalf_ = 0;
            return oh;
        }
    } else if (dir_ == 0) {
        iter_->resetToOffset(string_.length());
        dir_ = -1;
    } else if (dir_ == 1) {
        // previous() after setOffset()
        dir_ = -1;
    } else /* dir_ > 1 */ {
        // illegal change of direction
        status = U_INVALID_STATE_ERROR;
        return NULLORDER;
    }
    if (offsets_ == NULL) {
        offsets_ = new UVector32(status);
        if (offsets_ == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULLORDER;
        }
    }
    // If we already have expansion CEs, then we also have offsets.
    // Otherwise remember the trailing offset in case we need to
    // write offsets for an artificial expansion.
    int32_t limitOffset = iter_->getCEsLength() == 0 ? iter_->getOffset() : 0;
    int64_t ce = iter_->previousCE(*offsets_, status);
    if (ce == Collation::NO_CE) { return NULLORDER; }
    // Turn the 64-bit CE into two old-style 32-bit CEs, without quaternary bits.
    uint32_t p = (uint32_t)(ce >> 32);
    uint32_t lower32 = (uint32_t)ce;
    uint32_t firstHalf = getFirstHalf(p, lower32);
    uint32_t secondHalf = getSecondHalf(p, lower32);
    if (secondHalf != 0) {
        if (offsets_->isEmpty()) {
            // When we convert a single 64-bit CE into two 32-bit CEs,
            // we need to make this artificial expansion behave like a normal expansion.
            // See CollationIterator::previousCE().
            offsets_->addElement(iter_->getOffset(), status);
            offsets_->addElement(limitOffset, status);
        }
        otherHalf_ = firstHalf;
        return secondHalf | 0xc0;  // continuation CE
    }
    return firstHalf;
}